

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O2

ssize_t __thiscall
libtorrent::aux::posix_part_file::write(posix_part_file *this,int __fd,void *__buf,size_t __n)

{
  slot_index_t sVar1;
  int iVar2;
  iterator iVar3;
  void *pvVar4;
  int *piVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  int in_R8D;
  error_code *in_R9;
  piece_index_t piece_local;
  file_pointer f;
  
  piece_local.m_val = (int)__n;
  open_file((posix_part_file *)&f,(open_mode)this,(error_code *)0x1);
  uVar6 = 0xffffffffffffffff;
  if (in_R9->failed_ == false) {
    iVar3 = ::std::
            _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->m_piece_map)._M_h,&piece_local);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      sVar1 = allocate_slot(this,piece_local);
    }
    else {
      sVar1.m_val = *(int *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                                   ._M_cur + 0xc);
    }
    iVar2 = fseeko64((FILE *)f.ptr,
                     (long)in_R8D + (long)this->m_header_size +
                     (long)this->m_piece_size * (long)sVar1.m_val,0);
    if (iVar2 == 0) {
      pvVar4 = (void *)fwrite((void *)CONCAT44(in_register_00000034,__fd),1,(size_t)__buf,
                              (FILE *)f.ptr);
      if (pvVar4 == __buf) {
        uVar6 = (ulong)__buf & 0xffffffff;
        goto LAB_0026a08e;
      }
    }
    piVar5 = __errno_location();
    boost::system::error_code::assign
              (in_R9,*piVar5,
               &boost::system::detail::cat_holder<void>::generic_category_instance.
                super_error_category);
  }
LAB_0026a08e:
  file_pointer::~file_pointer(&f);
  return uVar6 & 0xffffffff;
}

Assistant:

int posix_part_file::write(span<char const> buf, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);

		auto f = open_file(open_mode::read_write, ec);
		if (ec) return -1;

		auto const i = m_piece_map.find(piece);
		slot_index_t const slot = (i == m_piece_map.end())
			? allocate_slot(piece) : i->second;

		if (portable_fseeko(f.file(), slot_offset(slot) + offset, SEEK_SET) != 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		auto const written = std::fwrite(buf.data(), 1, std::size_t(buf.size()), f.file());
		if (written != std::size_t(buf.size()))
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		return int(written);
	}